

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O0

void Gia_ManDumpVerilog(Gia_Man_t *p,char *pFileName,Vec_Int_t *vObjs)

{
  char cVar1;
  uint uVar2;
  int d;
  int iVar3;
  int iVar4;
  FILE *__stream;
  Vec_Bit_t *p_00;
  Vec_Bit_t *p_01;
  size_t sVar5;
  ushort **ppuVar6;
  char *pcVar7;
  Gia_Obj_t *pObj_00;
  bool bVar8;
  int fSkip;
  int iObj;
  int k;
  int i;
  int nDigits2;
  int nDigits;
  Vec_Bit_t *vUsed;
  Vec_Bit_t *vInvs;
  Gia_Obj_t *pObj;
  FILE *pFile;
  Vec_Int_t *vObjs_local;
  char *pFileName_local;
  Gia_Man_t *p_local;
  
  uVar2 = Gia_ManObjNum(p);
  d = Abc_Base10Log(uVar2);
  uVar2 = Gia_ManPiNum(p);
  iVar3 = Abc_Base10Log(uVar2);
  iVar4 = Gia_ManRegNum(p);
  if (iVar4 == 0) {
    __stream = fopen(pFileName,"wb");
    if (__stream == (FILE *)0x0) {
      printf("Cannot open output file \"%s\".\n",pFileName);
    }
    else {
      p_00 = Gia_ManGenUsed(p,0);
      p_01 = Gia_ManGenUsed(p,1);
      fprintf(__stream,"module ");
      for (iObj = 0; sVar5 = strlen(p->pName), iObj < (int)sVar5; iObj = iObj + 1) {
        ppuVar6 = __ctype_b_loc();
        if ((((*ppuVar6)[(int)p->pName[iObj]] & 0x400) == 0) &&
           (ppuVar6 = __ctype_b_loc(), ((*ppuVar6)[(int)p->pName[iObj]] & 0x800) == 0)) {
          fprintf(__stream,"_");
        }
        else {
          fprintf(__stream,"%c",(ulong)(uint)(int)p->pName[iObj]);
        }
      }
      fprintf(__stream," (\n    ");
      iVar4 = Gia_ManPiNum(p);
      Gia_ManWriteNames((FILE *)__stream,'x',iVar4,p->vNamesIn,4,4,(Vec_Bit_t *)0x0);
      fprintf(__stream,",\n    ");
      iVar4 = Gia_ManPoNum(p);
      Gia_ManWriteNames((FILE *)__stream,'z',iVar4,p->vNamesOut,4,4,(Vec_Bit_t *)0x0);
      fprintf(__stream,"\n  );\n\n");
      fprintf(__stream,"  input ");
      iVar4 = Gia_ManPiNum(p);
      Gia_ManWriteNames((FILE *)__stream,'x',iVar4,p->vNamesIn,8,4,(Vec_Bit_t *)0x0);
      fprintf(__stream,";\n\n");
      fprintf(__stream,"  output ");
      iVar4 = Gia_ManPoNum(p);
      Gia_ManWriteNames((FILE *)__stream,'z',iVar4,p->vNamesOut,9,4,(Vec_Bit_t *)0x0);
      fprintf(__stream,";\n\n");
      iVar4 = Vec_BitCount(p_01);
      if (iVar4 != 0) {
        fprintf(__stream,"  wire ");
        iVar4 = Gia_ManObjNum(p);
        Gia_ManWriteNames((FILE *)__stream,'n',iVar4,(Vec_Ptr_t *)0x0,7,4,p_01);
        fprintf(__stream,";\n\n");
      }
      iVar4 = Vec_BitCount(p_00);
      if (iVar4 != 0) {
        fprintf(__stream,"  wire ");
        iVar4 = Gia_ManObjNum(p);
        Gia_ManWriteNames((FILE *)__stream,'i',iVar4,(Vec_Ptr_t *)0x0,7,4,p_00);
        fprintf(__stream,";\n\n");
      }
      if (vObjs != (Vec_Int_t *)0x0) {
        fprintf(__stream,"  wire ");
        for (iObj = 0; iVar4 = Vec_IntSize(vObjs), iObj < iVar4; iObj = iObj + 1) {
          Vec_IntEntry(vObjs,iObj);
          iVar4 = Vec_IntSize(vObjs);
          pcVar7 = ",";
          if (iObj == iVar4 + -1) {
            pcVar7 = "";
          }
          fprintf(__stream," t_%d%s",(ulong)(uint)iObj,pcVar7);
        }
        fprintf(__stream,";\n\n");
        for (iObj = 0; iVar4 = Vec_IntSize(vObjs), iObj < iVar4; iObj = iObj + 1) {
          iVar4 = Vec_IntEntry(vObjs,iObj);
          pcVar7 = Gia_ObjGetDumpName((Vec_Ptr_t *)0x0,'n',iVar4,d);
          fprintf(__stream,"  buf( %s,",pcVar7);
          fprintf(__stream," t_%d );\n",(ulong)(uint)iObj);
        }
        fprintf(__stream,"\n");
      }
      iObj = 0;
      while( true ) {
        iVar4 = Gia_ManPiNum(p);
        bVar8 = false;
        if (iObj < iVar4) {
          vInvs = (Vec_Bit_t *)Gia_ManCi(p,iObj);
          bVar8 = vInvs != (Vec_Bit_t *)0x0;
        }
        if (!bVar8) break;
        iVar4 = Gia_ObjId(p,(Gia_Obj_t *)vInvs);
        iVar4 = Vec_BitEntry(p_01,iVar4);
        if (iVar4 != 0) {
          iVar4 = Gia_ObjId(p,(Gia_Obj_t *)vInvs);
          pcVar7 = Gia_ObjGetDumpName((Vec_Ptr_t *)0x0,'n',iVar4,d);
          fprintf(__stream,"  buf( %s,",pcVar7);
          pcVar7 = Gia_ObjGetDumpName(p->vNamesIn,'x',iObj,iVar3);
          fprintf(__stream," %s );\n",pcVar7);
        }
        iVar4 = Gia_ObjId(p,(Gia_Obj_t *)vInvs);
        iVar4 = Vec_BitEntry(p_00,iVar4);
        if (iVar4 != 0) {
          iVar4 = Gia_ObjId(p,(Gia_Obj_t *)vInvs);
          pcVar7 = Gia_ObjGetDumpName((Vec_Ptr_t *)0x0,'i',iVar4,d);
          fprintf(__stream,"  not( %s,",pcVar7);
          pcVar7 = Gia_ObjGetDumpName(p->vNamesIn,'x',iObj,iVar3);
          fprintf(__stream," %s );\n",pcVar7);
        }
        iObj = iObj + 1;
      }
      fprintf(__stream,"\n");
      iObj = 0;
      while( true ) {
        bVar8 = false;
        if (iObj < p->nObjs) {
          vInvs = (Vec_Bit_t *)Gia_ManObj(p,iObj);
          bVar8 = vInvs != (Vec_Bit_t *)0x0;
        }
        if (!bVar8) break;
        iVar3 = Gia_ObjIsAnd((Gia_Obj_t *)vInvs);
        if (iVar3 != 0) {
          bVar8 = false;
          if (vObjs != (Vec_Int_t *)0x0) {
            fSkip = 0;
            while ((iVar3 = Vec_IntSize(vObjs), fSkip < iVar3 &&
                   (iVar3 = Vec_IntEntry(vObjs,fSkip), iVar3 != iObj))) {
              fSkip = fSkip + 1;
            }
            iVar3 = Vec_IntSize(vObjs);
            bVar8 = fSkip < iVar3;
          }
          if (!bVar8) {
            pcVar7 = Gia_ObjGetDumpName((Vec_Ptr_t *)0x0,'n',iObj,d);
            fprintf(__stream,"  and( %s,",pcVar7);
            iVar3 = Gia_ObjFaninC0((Gia_Obj_t *)vInvs);
            cVar1 = 'n';
            if (iVar3 != 0) {
              cVar1 = 'i';
            }
            iVar3 = Gia_ObjFaninId0((Gia_Obj_t *)vInvs,iObj);
            pcVar7 = Gia_ObjGetDumpName((Vec_Ptr_t *)0x0,cVar1,iVar3,d);
            fprintf(__stream," %s,",pcVar7);
            iVar3 = Gia_ObjFaninC1((Gia_Obj_t *)vInvs);
            cVar1 = 'n';
            if (iVar3 != 0) {
              cVar1 = 'i';
            }
            iVar3 = Gia_ObjFaninId1((Gia_Obj_t *)vInvs,iObj);
            pcVar7 = Gia_ObjGetDumpName((Vec_Ptr_t *)0x0,cVar1,iVar3,d);
            fprintf(__stream," %s );\n",pcVar7);
          }
          iVar3 = Vec_BitEntry(p_00,iObj);
          if (iVar3 != 0) {
            pcVar7 = Gia_ObjGetDumpName((Vec_Ptr_t *)0x0,'i',iObj,d);
            fprintf(__stream,"  not( %s,",pcVar7);
            pcVar7 = Gia_ObjGetDumpName((Vec_Ptr_t *)0x0,'n',iObj,d);
            fprintf(__stream," %s );\n",pcVar7);
          }
        }
        iObj = iObj + 1;
      }
      fprintf(__stream,"\n");
      uVar2 = Gia_ManPoNum(p);
      iVar3 = Abc_Base10Log(uVar2);
      iObj = 0;
      while( true ) {
        iVar4 = Gia_ManPoNum(p);
        bVar8 = false;
        if (iObj < iVar4) {
          vInvs = (Vec_Bit_t *)Gia_ManCo(p,iObj);
          bVar8 = vInvs != (Vec_Bit_t *)0x0;
        }
        if (!bVar8) break;
        pcVar7 = Gia_ObjGetDumpName(p->vNamesOut,'z',iObj,iVar3);
        fprintf(__stream,"  buf( %s, ",pcVar7);
        pObj_00 = Gia_ObjFanin0((Gia_Obj_t *)vInvs);
        iVar4 = Gia_ObjIsConst0(pObj_00);
        if (iVar4 == 0) {
          iVar4 = Gia_ObjFaninC0((Gia_Obj_t *)vInvs);
          cVar1 = 'n';
          if (iVar4 != 0) {
            cVar1 = 'i';
          }
          iVar4 = Gia_ObjFaninId0p(p,(Gia_Obj_t *)vInvs);
          pcVar7 = Gia_ObjGetDumpName((Vec_Ptr_t *)0x0,cVar1,iVar4,d);
          fprintf(__stream,"%s );\n",pcVar7);
        }
        else {
          uVar2 = Gia_ObjFaninC0((Gia_Obj_t *)vInvs);
          fprintf(__stream,"1\'b%d );\n",(ulong)uVar2);
        }
        iObj = iObj + 1;
      }
      fprintf(__stream,"\nendmodule\n\n");
      fclose(__stream);
      Vec_BitFree(p_00);
      Vec_BitFree(p_01);
    }
  }
  else {
    printf("Currently cannot write sequential AIG.\n");
  }
  return;
}

Assistant:

void Gia_ManDumpVerilog( Gia_Man_t * p, char * pFileName, Vec_Int_t * vObjs )
{
    FILE * pFile;
    Gia_Obj_t * pObj;
    Vec_Bit_t * vInvs, * vUsed;
    int nDigits = Abc_Base10Log( Gia_ManObjNum(p) );
    int nDigits2 = Abc_Base10Log( Gia_ManPiNum(p) );
    int i, k, iObj;
    if ( Gia_ManRegNum(p) )
    {
        printf( "Currently cannot write sequential AIG.\n" );
        return;
    }
    pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open output file \"%s\".\n", pFileName );
        return;
    }

    vInvs = Gia_ManGenUsed( p, 0 );
    vUsed = Gia_ManGenUsed( p, 1 );

    //fprintf( pFile, "// This Verilog file is written by ABC on %s\n\n", Extra_TimeStamp() );

    fprintf( pFile, "module " );
    for ( i = 0; i < (int)strlen(p->pName); i++ )
        if ( isalpha(p->pName[i]) || isdigit(p->pName[i]) )
            fprintf( pFile, "%c", p->pName[i] );
        else
            fprintf( pFile, "_" );
    fprintf( pFile, " (\n    " );
    Gia_ManWriteNames( pFile, 'x', Gia_ManPiNum(p), p->vNamesIn, 4, 4, NULL );
    fprintf( pFile, ",\n    " );

    Gia_ManWriteNames( pFile, 'z', Gia_ManPoNum(p), p->vNamesOut, 4, 4, NULL );
    fprintf( pFile, "\n  );\n\n" );

    fprintf( pFile, "  input " );
    Gia_ManWriteNames( pFile, 'x', Gia_ManPiNum(p), p->vNamesIn, 8, 4, NULL );
    fprintf( pFile, ";\n\n" );

    fprintf( pFile, "  output " );
    Gia_ManWriteNames( pFile, 'z', Gia_ManPoNum(p), p->vNamesOut, 9, 4, NULL );
    fprintf( pFile, ";\n\n" );

    if ( Vec_BitCount(vUsed) )
    {
        fprintf( pFile, "  wire " );
        Gia_ManWriteNames( pFile, 'n', Gia_ManObjNum(p), NULL, 7, 4, vUsed );
        fprintf( pFile, ";\n\n" );
    }

    if ( Vec_BitCount(vInvs) )
    {
        fprintf( pFile, "  wire " );
        Gia_ManWriteNames( pFile, 'i', Gia_ManObjNum(p), NULL, 7, 4, vInvs );
        fprintf( pFile, ";\n\n" );
    }

    if ( vObjs )
    {
        fprintf( pFile, "  wire " );
        Vec_IntForEachEntry( vObjs, iObj, i )
            fprintf( pFile, " t_%d%s", i, i==Vec_IntSize(vObjs)-1 ? "" : "," ); 
        fprintf( pFile, ";\n\n" );
        Vec_IntForEachEntry( vObjs, iObj, i )
        {
            fprintf( pFile, "  buf( %s,", Gia_ObjGetDumpName(NULL, 'n', iObj, nDigits) );
            fprintf( pFile, " t_%d );\n", i );
        }
        fprintf( pFile, "\n" );
    }

    // input inverters
    Gia_ManForEachPi( p, pObj, i )
    {
        if ( Vec_BitEntry(vUsed, Gia_ObjId(p, pObj)) )
        {
            fprintf( pFile, "  buf( %s,", Gia_ObjGetDumpName(NULL, 'n', Gia_ObjId(p, pObj), nDigits) );
            fprintf( pFile, " %s );\n",   Gia_ObjGetDumpName(p->vNamesIn, 'x', i, nDigits2) );
        }
        if ( Vec_BitEntry(vInvs, Gia_ObjId(p, pObj)) )
        {
            fprintf( pFile, "  not( %s,", Gia_ObjGetDumpName(NULL, 'i', Gia_ObjId(p, pObj), nDigits) );
            fprintf( pFile, " %s );\n",   Gia_ObjGetDumpName(p->vNamesIn, 'x', i, nDigits2) );
        }
    }

    // internal nodes and their inverters
    fprintf( pFile, "\n" );
    Gia_ManForEachAnd( p, pObj, i )
    {
        int fSkip = 0;
        if ( vObjs )
        {
            Vec_IntForEachEntry( vObjs, iObj, k )
                if ( iObj == i )
                    break;
            if ( k < Vec_IntSize(vObjs) )
                fSkip = 1;
        }
        if ( !fSkip )
        {
            fprintf( pFile, "  and( %s,", Gia_ObjGetDumpName(NULL, 'n', i, nDigits) );
            fprintf( pFile, " %s,",       Gia_ObjGetDumpName(NULL, (char)(Gia_ObjFaninC0(pObj)? 'i':'n'), Gia_ObjFaninId0(pObj, i), nDigits) );
            fprintf( pFile, " %s );\n",   Gia_ObjGetDumpName(NULL, (char)(Gia_ObjFaninC1(pObj)? 'i':'n'), Gia_ObjFaninId1(pObj, i), nDigits) );
        }
        if ( Vec_BitEntry(vInvs, i) )
        {
            fprintf( pFile, "  not( %s,", Gia_ObjGetDumpName(NULL, 'i', i, nDigits) );
            fprintf( pFile, " %s );\n",   Gia_ObjGetDumpName(NULL, 'n', i, nDigits) );
        }
    }
    
    // output drivers
    fprintf( pFile, "\n" );
    nDigits2 = Abc_Base10Log( Gia_ManPoNum(p) );
    Gia_ManForEachPo( p, pObj, i )
    {
/*
        fprintf( pFile, "  assign %s = ", Gia_ObjGetDumpName(p->vNamesOut, 'z', i, nDigits2) );
        if ( Gia_ObjIsConst0(Gia_ObjFanin0(pObj)) )
            fprintf( pFile, "1\'b%d;\n", Gia_ObjFaninC0(pObj) );
        else 
            fprintf( pFile, "%s;\n", Gia_ObjGetDumpName(NULL, (char)(Gia_ObjFaninC0(pObj)? 'i':'n'), Gia_ObjFaninId0p(p, pObj), nDigits) );
*/
        fprintf( pFile, "  buf( %s, ", Gia_ObjGetDumpName(p->vNamesOut, 'z', i, nDigits2) );
        if ( Gia_ObjIsConst0(Gia_ObjFanin0(pObj)) )
            fprintf( pFile, "1\'b%d );\n", Gia_ObjFaninC0(pObj) );
        else 
            fprintf( pFile, "%s );\n", Gia_ObjGetDumpName(NULL, (char)(Gia_ObjFaninC0(pObj)? 'i':'n'), Gia_ObjFaninId0p(p, pObj), nDigits) );
    }

    fprintf( pFile, "\nendmodule\n\n" );
    fclose( pFile );

    Vec_BitFree( vInvs );
    Vec_BitFree( vUsed );
}